

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O1

bool __thiscall
GGSock::Unserialize::operator()
          (Unserialize *this,
          map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
          *t,char *bufferData,size_t bufferSize,size_t *offset)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  mapped_type *this_00;
  int iVar4;
  int k;
  int32_t n;
  FileInfo v;
  key_type local_b0;
  int local_ac;
  size_t *local_a8;
  FileInfo *local_a0;
  char *local_98;
  ulong *local_90;
  map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
  *local_88;
  undefined2 *local_80;
  undefined8 local_78;
  undefined2 local_70 [8];
  TFilesize local_60;
  undefined2 *local_58;
  undefined8 local_50;
  undefined2 local_48 [8];
  int32_t local_38;
  
  local_ac = 0;
  local_a8 = offset;
  local_a0 = (FileInfo *)this;
  local_98 = bufferData;
  local_90 = (ulong *)bufferSize;
  local_88 = t;
  bVar1 = GGSock::Unserialize::operator()
                    ((int *)this,(char *)&local_ac,(ulong)bufferData,(ulong *)bufferSize);
  if (0 < local_ac) {
    iVar4 = 0;
    do {
      local_80 = local_70;
      local_70[0] = 0x3f;
      local_78 = 1;
      local_60 = 0;
      local_48[0] = 0x3f;
      local_50 = 1;
      local_38 = 0;
      local_58 = local_48;
      bVar2 = GGSock::Unserialize::operator()
                        ((int *)local_a0,(char *)&local_b0,(ulong)local_98,local_90);
      bVar3 = GGSock::Unserialize::operator()(local_a0,(char *)&local_80,(ulong)local_98,local_90);
      this_00 = std::
                map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
                ::operator[](local_88,&local_b0);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_80);
      this_00->filesize = local_60;
      std::__cxx11::string::operator=((string *)&this_00->filename,(string *)&local_58);
      this_00->nChunks = local_38;
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      bVar1 = (bool)(bVar1 & (bVar2 && bVar3));
      iVar4 = iVar4 + 1;
    } while (iVar4 < local_ac);
  }
  return bVar1;
}

Assistant:

bool Unserialize::operator()(std::map<Key, Value> & t, const char * bufferData, size_t bufferSize, size_t & offset) {
    bool res = true;

    int32_t n = 0;
    res &= operator()(n, bufferData, bufferSize, offset);
    for (int i = 0; i < n; ++i) {
        Key k;
        Value v;
        res &= operator()(k, bufferData, bufferSize, offset);
        res &= operator()(v, bufferData, bufferSize, offset);
        t[k] = std::move(v);
    }

    return res;
}